

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O1

bool dxil_spv::emit_create_handle_instruction(Impl *impl,CallInst *instruction)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ResourceType resource_type;
  bool bVar3;
  size_type sVar4;
  Value *instruction_offset;
  ulong uVar5;
  _Node_iterator_base<const_LLVMBC::CallInst_*,_false> __it;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  uint32_t resource_type_operand;
  uint32_t resource_range;
  uint32_t non_uniform;
  CallInst *local_38;
  uint local_30;
  uint32_t local_2c;
  
  local_38 = instruction;
  if (((impl->options).descriptor_qa_enabled == true) &&
     ((impl->options).descriptor_qa_sink_handles == true)) {
    sVar4 = std::
            _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(impl->resource_handles_needing_sink)._M_h,&local_38);
    if (sVar4 != 0) {
      uVar1 = (impl->resource_handles_needing_sink)._M_h._M_bucket_count;
      uVar5 = (ulong)instruction % uVar1;
      p_Var6 = (impl->resource_handles_needing_sink)._M_h._M_buckets[uVar5];
      p_Var7 = (__node_base_ptr)0x0;
      if ((p_Var6 != (__node_base_ptr)0x0) &&
         (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6,
         (CallInst *)p_Var6->_M_nxt[1]._M_nxt != instruction)) {
        while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
          p_Var7 = (__node_base_ptr)0x0;
          if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
             (p_Var7 = p_Var6, (CallInst *)p_Var2[1]._M_nxt == instruction)) goto LAB_001621d5;
        }
        p_Var7 = (__node_base_ptr)0x0;
      }
LAB_001621d5:
      if (p_Var7 == (__node_base_ptr)0x0) {
        __it._M_cur = (__node_type *)0x0;
      }
      else {
        __it._M_cur = (__node_type *)p_Var7->_M_nxt;
      }
      std::
      _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::erase(&(impl->resource_handles_needing_sink)._M_h,(const_iterator)__it._M_cur);
      return true;
    }
  }
  bVar3 = get_constant_operand(&instruction->super_Instruction,1,(uint32_t *)&local_38);
  if ((bVar3) && (bVar3 = get_constant_operand(&instruction->super_Instruction,2,&local_30), bVar3))
  {
    local_2c = 0;
    get_constant_operand(&instruction->super_Instruction,4,&local_2c);
    resource_type = (ResourceType)local_38;
    instruction_offset = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
    bVar3 = emit_create_handle(impl,instruction,resource_type,local_30,instruction_offset,
                               local_2c != 0);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool emit_create_handle_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (resource_handle_needs_sink(impl, instruction))
	{
		impl.resource_handles_needing_sink.erase(impl.resource_handles_needing_sink.find(instruction));
		return true;
	}

	uint32_t resource_type_operand, resource_range;

	if (!get_constant_operand(instruction, 1, &resource_type_operand))
		return false;
	if (!get_constant_operand(instruction, 2, &resource_range))
		return false;

	uint32_t non_uniform = 0;
	get_constant_operand(instruction, 4, &non_uniform);

	auto resource_type = static_cast<DXIL::ResourceType>(resource_type_operand);
	return emit_create_handle(impl, instruction, resource_type, resource_range,
	                          instruction->getOperand(3), non_uniform != 0);
}